

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.cpp
# Opt level: O0

void __thiscall
adios2::core::Stream::Stream
          (Stream *this,string *name,Mode mode,Comm *comm,string *configFile,string *ioInConfigFile,
          string *hostLanguage)

{
  _Head_base<0UL,_adios2::helper::CommImpl_*,_false> _Var1;
  int in_EDX;
  Stream *in_RSI;
  Comm *in_RDI;
  string *in_R9;
  ArrayOrdering in_stack_0000017c;
  string *in_stack_00000180;
  ADIOS *in_stack_00000188;
  Comm *pCVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  string local_50 [60];
  int local_14;
  Stream *local_10;
  
  pCVar2 = in_RDI;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::
  make_shared<adios2::core::ADIOS,std::__cxx11::string_const&,adios2::helper::Comm,std::__cxx11::string_const&>
            (in_stack_ffffffffffffff88,in_RDI,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  pCVar2 = pCVar2 + 2;
  std::__shared_ptr_access<adios2::core::ADIOS,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<adios2::core::ADIOS,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x901a29);
  std::__cxx11::string::string(local_50,in_R9);
  _Var1._M_head_impl =
       (CommImpl *)ADIOS::DeclareIO(in_stack_00000188,in_stack_00000180,in_stack_0000017c);
  std::__cxx11::string::~string(local_50);
  (pCVar2->m_Impl)._M_t.
  super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>.
  _M_t.
  super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
  .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl = _Var1._M_head_impl;
  in_RDI[3].m_Impl._M_t.
  super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>.
  _M_t.
  super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
  .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl = (CommImpl *)0x0;
  std::__cxx11::string::string((string *)(in_RDI + 4),(string *)local_10);
  *(int *)&in_RDI[8].m_Impl._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl = local_14;
  std::__cxx11::string::string((string *)(in_RDI + 9));
  *(undefined1 *)
   &in_RDI[0xd].m_Impl._M_t.
    super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>.
    _M_t.
    super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
    .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl = 1;
  *(undefined1 *)
   ((long)&in_RDI[0xd].m_Impl._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl + 1) = 0;
  if ((local_14 == 2) || (local_14 == 4)) {
    CheckOpen(in_RSI);
  }
  return;
}

Assistant:

Stream::Stream(const std::string &name, const Mode mode, helper::Comm comm,
               const std::string configFile, const std::string ioInConfigFile,
               const std::string hostLanguage)
: m_ADIOS(std::make_shared<ADIOS>(configFile, std::move(comm), hostLanguage)),
  m_IO(&m_ADIOS->DeclareIO(ioInConfigFile)), m_Name(name), m_Mode(mode)
{
    if ((mode == adios2::Mode::Read) || (mode == adios2::Mode::ReadRandomAccess))
    {
        CheckOpen();
    }
}